

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

void ImGui::SetCursorPosY(float y)

{
  ImGuiWindow *pIVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  fVar2 = ((pIVar1->Pos).y - (pIVar1->Scroll).y) + y;
  (pIVar1->DC).CursorPos.y = fVar2;
  auVar4 = ZEXT416((uint)(pIVar1->DC).CursorMaxPos.y);
  auVar3 = vcmpss_avx(ZEXT416((uint)fVar2),auVar4,2);
  auVar3 = vblendvps_avx(ZEXT416((uint)fVar2),auVar4,auVar3);
  (pIVar1->DC).CursorMaxPos.y = auVar3._0_4_;
  return;
}

Assistant:

inline    ImGuiWindow*  GetCurrentWindow()          { ImGuiContext& g = *GImGui; g.CurrentWindow->WriteAccessed = true; return g.CurrentWindow; }